

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O0

void __thiscall
google::
sparse_hashtable<std::pair<int_const,int>,int,Hasher,google::sparse_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::sparse_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
::insert<std::_Rb_tree_const_iterator<std::pair<int_const,int>>>(void *param_1)

{
  unsigned_long uVar1;
  length_error *this;
  size_type in_stack_00000040;
  sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_00000048;
  const_reference in_stack_00000088;
  size_t dist;
  _Rb_tree_const_iterator<std::pair<const_int,_int>_> *in_stack_ffffffffffffff50;
  _Rb_tree_const_iterator<std::pair<const_int,_int>_> in_stack_ffffffffffffff60;
  ulong uVar2;
  ulong local_28;
  
  local_28 = std::distance<std::_Rb_tree_const_iterator<std::pair<int_const,int>>>
                       (in_stack_ffffffffffffff60,
                        (_Rb_tree_const_iterator<std::pair<const_int,_int>_>)param_1);
  uVar2 = local_28;
  uVar1 = std::numeric_limits<unsigned_long>::max();
  if (uVar1 <= uVar2) {
    this = (length_error *)__cxa_allocate_exception(0x10);
    std::length_error::length_error(this,"insert-range overflow");
    __cxa_throw(this,&std::length_error::typeinfo,std::length_error::~length_error);
  }
  sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(in_stack_00000048,in_stack_00000040);
  while (local_28 != 0) {
    std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator*
              ((_Rb_tree_const_iterator<std::pair<const_int,_int>_> *)0xe3c637);
    sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::insert_noresize((sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                       *)dist,in_stack_00000088);
    local_28 = local_28 - 1;
    std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator++(in_stack_ffffffffffffff50);
  }
  return;
}

Assistant:

void insert(ForwardIterator f, ForwardIterator l, std::forward_iterator_tag) {
    size_t dist = std::distance(f, l);
    if (dist >= (std::numeric_limits<size_type>::max)()) {
      throw std::length_error("insert-range overflow");
    }
    resize_delta(static_cast<size_type>(dist));
    for (; dist > 0; --dist, ++f) {
      insert_noresize(*f);
    }
  }